

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall
Minisat::Solver::simplifyLearnt<Minisat::vec<Minisat::Lit>>(Solver *this,vec<Minisat::Lit> *c)

{
  uint64_t *puVar1;
  Lit *pLVar2;
  Lit *pLVar3;
  bool bVar4;
  CRef confl;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  lbool local_5e;
  lbool local_5d;
  int local_5c;
  vec<Minisat::Lit> *local_58;
  ulong local_50;
  vec<unsigned_int> *local_48;
  long local_40;
  ulong local_38;
  
  lVar6 = (long)c->sz;
  this->original_length_record = this->original_length_record + lVar6;
  this->trailRecord = (this->trail).sz;
  this->LCM_total_tries = this->LCM_total_tries + 1;
  local_58 = &this->simp_learnt_clause;
  local_48 = &this->simp_reason_clause;
  uVar8 = 0;
  local_5c = 0;
  local_50 = 0;
  local_40 = lVar6;
  do {
    iVar5 = (int)lVar6;
    if ((ulong)this->reverse_LCM + 1 <= uVar8) {
LAB_0011f523:
      if ((local_50 & 1) != 0) {
        vec<Minisat::Lit>::reverse(c);
        iVar5 = c->sz;
      }
      this->LCM_successful_tries = this->LCM_successful_tries + (ulong)((int)local_40 != iVar5);
      return;
    }
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + 1;
    local_38 = uVar8;
    if (uVar8 != 0) {
      if (iVar5 == 1) {
        iVar5 = 1;
        goto LAB_0011f523;
      }
      vec<Minisat::Lit>::reverse(c);
      local_50 = local_50 ^ 1;
      local_5c = c->sz;
    }
    newDecisionLevel(this);
    iVar5 = 0;
    for (lVar6 = 0; lVar6 < c->sz; lVar6 = lVar6 + 1) {
      iVar9 = c->data[lVar6].x;
      local_5d.value = (byte)iVar9 & 1 ^ (this->assigns).data[iVar9 >> 1].value;
      bVar4 = lbool::operator==(&local_5d,(lbool)0x2);
      if (bVar4) {
        simpleUncheckEnqueue(this,(Lit)(c->data[lVar6].x ^ 1),0xffffffff);
        iVar9 = iVar5 + 1;
        c->data[iVar5].x = c->data[lVar6].x;
        confl = simplePropagate(this);
        iVar5 = iVar9;
        if (confl != 0xffffffff) {
          bVar4 = false;
          goto LAB_0011f408;
        }
      }
      else {
        iVar9 = c->data[lVar6].x;
        local_5e.value = (byte)iVar9 & 1 ^ (this->assigns).data[iVar9 >> 1].value;
        bVar4 = lbool::operator==(&local_5e,(lbool)0x0);
        if (bVar4) {
          iVar9 = c->data[lVar6].x;
          c->data[iVar5].x = iVar9;
          confl = (this->vardata).data[iVar9 >> 1].reason;
          bVar4 = true;
          iVar5 = iVar5 + 1;
          goto LAB_0011f408;
        }
      }
    }
    bVar4 = false;
    confl = 0xffffffff;
LAB_0011f408:
    vec<Minisat::Lit>::shrink(c,c->sz - iVar5);
    if (!(bool)(confl == 0xffffffff & (bVar4 ^ 1U))) {
      if (local_58->data != (Lit *)0x0) {
        (this->simp_learnt_clause).sz = 0;
      }
      if (local_48->data != (uint *)0x0) {
        (this->simp_reason_clause).sz = 0;
      }
      if (bVar4 != false) {
        vec<Minisat::Lit>::push(local_58,c->data + (long)c->sz + -1);
      }
      simpleAnalyze(this,confl,local_58,local_48,bVar4);
      iVar5 = (this->simp_learnt_clause).sz;
      if (iVar5 < c->sz) {
        pLVar2 = local_58->data;
        pLVar3 = c->data;
        for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
          pLVar3[lVar6].x = pLVar2[lVar6].x;
          iVar5 = (this->simp_learnt_clause).sz;
        }
        vec<Minisat::Lit>::shrink(c,c->sz - (int)lVar6);
      }
    }
    cancelUntil(this,0,false);
    cancelUntilTrailRecord(this);
    iVar5 = c->sz;
    lVar6 = (long)iVar5;
    this->simplified_length_record = this->simplified_length_record + lVar6;
    iVar9 = (int)local_40 - iVar5;
    if ((iVar9 == 0) || (iVar5 < 2)) goto LAB_0011f523;
    this->LCM_dropped_lits = this->LCM_dropped_lits + (long)iVar9;
    lVar7 = (long)(local_5c - iVar5);
    if (local_38 == 0) {
      lVar7 = 0;
    }
    this->LCM_dropped_reverse = this->LCM_dropped_reverse + lVar7;
    uVar8 = local_38 + 1;
  } while( true );
}

Assistant:

inline void Solver::simplifyLearnt(C &c)
{
    ////
    original_length_record += c.size();

    trailRecord = trail.size(); // record the start pointer

    bool True_confl = false, reversed = false;
    int beforeSize = c.size(), preReserve = 0;
    int i, j;
    CRef confl = CRef_Undef;

    LCM_total_tries++;

    TRACE(std::cout << "c start simplifying clause " << c << std::endl);

    // try to simplify in reverse order, in case original succeeds
    for (size_t iteration = 0; iteration < (reverse_LCM ? 2 : 1); ++iteration) {
        True_confl = false;
        confl = CRef_Undef;
        statistics.solveSteps++;
        // reorder the current clause for next iteration?
        // (only useful if size changed in first iteration)
        if (iteration > 0) {
            if (c.size() == 1) break;
            c.reverse();
            reversed = !reversed;
            preReserve = c.size();
        }

        assert(decisionLevel() == 0 && "only run simplification on level 0");
        newDecisionLevel();
        assert(decisionLevel() == 1 && "only run simplification on level 0");

        for (i = 0, j = 0; i < c.size(); i++) {
            if (value(c[i]) == l_Undef) {
                // printf("///@@@ uncheckedEnqueue:index = %d. l_Undef\n", i);
                simpleUncheckEnqueue(~c[i]);
                c[j++] = c[i];
                confl = simplePropagate();
                if (confl != CRef_Undef) {
                    break;
                }
            } else {
                if (value(c[i]) == l_True) {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_True\n", i);
                    c[j++] = c[i];
                    True_confl = true;
                    confl = reason(var(c[i]));
                    break;
                } else {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_False\n", i);
                }
            }
        }
        TRACE(if (c.size() - j > 0) {
            std::cout << "c shrink clause after propagation to " << c << " (dropping last " << c.size() - j
                      << " literals, reverse=" << reversed << ")" << std::endl;
        });
        c.shrink(c.size() - j);

        if (confl != CRef_Undef || True_confl == true) {
            simp_learnt_clause.clear();
            simp_reason_clause.clear();
            if (True_confl == true) {
                simp_learnt_clause.push(c.last());
            }
            simpleAnalyze(confl, simp_learnt_clause, simp_reason_clause, True_confl);

            if (simp_learnt_clause.size() < c.size()) {
                for (i = 0; i < simp_learnt_clause.size(); i++) {
                    c[i] = simp_learnt_clause[i];
                }
                TRACE(if (c.size() - i > 0) {
                    std::cout << "c shrink clause after analysis to " << c << " (dropping last " << c.size() - i
                              << " literals, reverse=" << reversed << ")" << std::endl;
                });
                c.shrink(c.size() - i);
            }
        }

        assert(decisionLevel() == 1);
        cancelUntil(0);
        cancelUntilTrailRecord();
        assert(decisionLevel() == 0);

        ////
        simplified_length_record += c.size();

        // printf("\nbefore : %d, after : %d ", beforeSize, afterSize);
        if (beforeSize == c.size() || c.size() <= 1) break;
        TRACE(std::cout << "c simplified clause to " << c << " (before size: " << beforeSize << ")" << std::endl);
        LCM_dropped_lits += (beforeSize - c.size());
        LCM_dropped_reverse = iteration == 0 ? LCM_dropped_reverse : LCM_dropped_reverse + (preReserve - c.size());
    }

    // make sure the original order is restored, in case we resorted
    if (reversed) c.reverse();

    LCM_successful_tries = beforeSize == c.size() ? LCM_successful_tries : LCM_successful_tries + 1;
}